

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.cpp
# Opt level: O2

void __thiscall Sexp::TracePointers(Sexp *this,function<void_(Sexp_**)> *func)

{
  Activation *pAVar1;
  function<void_(Sexp_**)> *this_00;
  function<void_(Sexp_**)> local_88;
  function<void_(Sexp_**)> local_68;
  function<void_(Sexp_**)> local_48;
  
  switch(this->kind) {
  case ACTIVATION:
    pAVar1 = (this->field_1).activation;
    std::function<void_(Sexp_**)>::function(&local_68,func);
    Activation::TracePointers(pAVar1,&local_68);
    this_00 = &local_68;
    goto LAB_00112e5a;
  case FUNCTION:
  case MACRO:
    pAVar1 = (this->field_1).activation;
    std::function<void_(Sexp_**)>::function(&local_88,func);
    (**(code **)(pAVar1->parent + 1))(pAVar1,&local_88);
    std::_Function_base::~_Function_base(&local_88.super__Function_base);
    std::function<void_(Sexp_**)>::operator()(func,&(this->field_1).cons.cdr);
    break;
  case NATIVE_FUNCTION:
  case CHARACTER:
  case PORT:
    break;
  case MEANING:
    pAVar1 = (this->field_1).activation;
    std::function<void_(Sexp_**)>::function(&local_48,func);
    (**(code **)(pAVar1->parent + 1))(pAVar1,&local_48);
    this_00 = &local_48;
LAB_00112e5a:
    std::_Function_base::~_Function_base(&this_00->super__Function_base);
    break;
  default:
    if (this->kind == CONS) {
      std::function<void_(Sexp_**)>::operator()(func,(Sexp **)&(this->field_1).port_value);
      std::function<void_(Sexp_**)>::operator()(func,&(this->field_1).cons.cdr);
      return;
    }
  }
  return;
}

Assistant:

void Sexp::TracePointers(std::function<void(Sexp **)> func) {
  switch (kind) {
  case Sexp::Kind::CONS:
    func(&this->cons.car);
    func(&this->cons.cdr);
    break;
  case Sexp::Kind::MACRO:
  case Sexp::Kind::FUNCTION:
    this->function.func_meaning->TracePointers(func);
    func(&this->function.activation);
    break;
  case Sexp::Kind::ACTIVATION:
    this->activation->TracePointers(func);
    break;
  case Sexp::Kind::MEANING:
    this->meaning->TracePointers(func);
  default:
    break;
  }
}